

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QCss::MediaRule>::moveAppend
          (QGenericArrayOps<QCss::MediaRule> *this,MediaRule *b,MediaRule *e)

{
  MediaRule *pMVar1;
  Data *pDVar2;
  QString *pQVar3;
  qsizetype qVar4;
  Data *pDVar5;
  StyleRule *pSVar6;
  qsizetype qVar7;
  
  if ((b != e) && (b < e)) {
    pMVar1 = (this->super_QArrayDataPointer<QCss::MediaRule>).ptr;
    qVar7 = (this->super_QArrayDataPointer<QCss::MediaRule>).size;
    do {
      pDVar2 = (b->media).d.d;
      (b->media).d.d = (Data *)0x0;
      pMVar1[qVar7].media.d.d = pDVar2;
      pQVar3 = (b->media).d.ptr;
      (b->media).d.ptr = (QString *)0x0;
      pMVar1[qVar7].media.d.ptr = pQVar3;
      qVar4 = (b->media).d.size;
      (b->media).d.size = 0;
      pMVar1[qVar7].media.d.size = qVar4;
      pDVar5 = (b->styleRules).d.d;
      (b->styleRules).d.d = (Data *)0x0;
      pMVar1[qVar7].styleRules.d.d = pDVar5;
      pSVar6 = (b->styleRules).d.ptr;
      (b->styleRules).d.ptr = (StyleRule *)0x0;
      pMVar1[qVar7].styleRules.d.ptr = pSVar6;
      qVar4 = (b->styleRules).d.size;
      (b->styleRules).d.size = 0;
      pMVar1[qVar7].styleRules.d.size = qVar4;
      b = b + 1;
      qVar7 = (this->super_QArrayDataPointer<QCss::MediaRule>).size + 1;
      (this->super_QArrayDataPointer<QCss::MediaRule>).size = qVar7;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }